

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O3

int mk_node(dtree_node_t *node,uint32 node_id,uint32 *id,uint32 n_id,float32 ****mixw,
           float32 ****means,float32 ****vars,uint32 *veclen,uint32 n_model,uint32 n_state,
           uint32 n_stream,uint32 n_density,float32 *stwt,float32 mwfloor)

{
  double dVar1;
  uint uVar2;
  float32 *pfVar3;
  float32 *pfVar4;
  float *pfVar5;
  int iVar6;
  cmd_ln_t *pcVar7;
  char *__s1;
  ulong uVar8;
  float32 ***pppfVar9;
  void *tmpptr;
  void *ptr;
  uint32 *puVar10;
  ulong uVar11;
  ulong uVar12;
  size_t sVar13;
  uint uVar14;
  ulong uVar15;
  float32 *pfVar16;
  float32 *pfVar17;
  ulong uVar18;
  ulong uVar19;
  size_t d2;
  float fVar20;
  double dVar21;
  double dVar22;
  float fVar23;
  float fVar24;
  float32 fVar25;
  double local_78;
  float32 ***local_70;
  float32 ***local_68;
  
  pcVar7 = cmd_ln_get();
  __s1 = cmd_ln_str_r(pcVar7,"-ts2cbfn");
  iVar6 = strcmp(__s1,".semi.");
  if ((iVar6 != 0) && (iVar6 = strcmp(__s1,".cont."), iVar6 != 0)) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
            ,0x326,"Type %s unsupported; trees can only be built on types .semi. or .cont.\n",__s1);
LAB_0010e14b:
    exit(1);
  }
  iVar6 = strcmp(__s1,".cont.");
  uVar12 = (ulong)n_state;
  if (iVar6 == 0) {
    pcVar7 = cmd_ln_get();
    dVar21 = cmd_ln_float_r(pcVar7,"-varfloor");
    uVar15 = 0;
    if (n_stream == 0) {
      d2 = 0;
    }
    else {
      d2 = (size_t)n_stream;
      uVar8 = 0;
      do {
        uVar14 = (int)uVar15 + veclen[uVar8];
        uVar15 = (ulong)uVar14;
        uVar8 = uVar8 + 1;
      } while (d2 != uVar8);
      uVar15 = (ulong)uVar14;
    }
    fVar20 = (float)dVar21;
    local_68 = (float32 ***)
               __ckd_calloc_3d__(uVar12,d2,uVar15,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                                 ,0x331);
    local_70 = (float32 ***)
               __ckd_calloc_3d__(uVar12,d2,uVar15,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                                 ,0x332);
  }
  else {
    d2 = (size_t)n_stream;
    fVar20 = 0.0;
    local_68 = (float32 ***)0x0;
    local_70 = (float32 ***)0x0;
  }
  uVar8 = (ulong)n_density;
  pppfVar9 = (float32 ***)
             __ckd_calloc_3d__(uVar12,d2,uVar8,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                               ,0x335);
  tmpptr = __ckd_calloc_2d__(d2,uVar8,4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                             ,0x336);
  ptr = __ckd_calloc__(d2,8,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                       ,0x337);
  uVar15 = (ulong)n_id;
  if (n_state == 0) {
    uVar11 = 0;
  }
  else {
    uVar11 = 0;
    do {
      if (n_stream != 0) {
        sVar13 = 0;
        do {
          if (iVar6 == 0) {
            pfVar16 = local_68[uVar11][sVar13];
            pfVar17 = local_70[uVar11][sVar13];
          }
          else {
            pfVar16 = (float32 *)0x0;
            pfVar17 = (float32 *)0x0;
          }
          if (n_id != 0) {
            uVar18 = 0;
            do {
              uVar14 = id[uVar18];
              if (n_density != 0) {
                pfVar3 = mixw[uVar14][uVar11][sVar13];
                pfVar4 = pppfVar9[uVar11][sVar13];
                uVar19 = 0;
                do {
                  pfVar4[uVar19] = (float32)((float)pfVar3[uVar19] + (float)pfVar4[uVar19]);
                  uVar19 = uVar19 + 1;
                } while (uVar8 != uVar19);
              }
              if ((iVar6 == 0) && (uVar2 = veclen[sVar13], (ulong)uVar2 != 0)) {
                pfVar5 = (float *)mixw[uVar14][uVar11][sVar13];
                pfVar3 = means[uVar14][uVar11][sVar13];
                pfVar4 = vars[uVar14][uVar11][sVar13];
                uVar19 = 0;
                do {
                  pfVar16[uVar19] =
                       (float32)(*pfVar5 * (float)pfVar3[uVar19] + (float)pfVar16[uVar19]);
                  fVar23 = (float)pfVar3[uVar19];
                  pfVar17[uVar19] =
                       (float32)((fVar23 * fVar23 + (float)pfVar4[uVar19]) * *pfVar5 +
                                (float)pfVar17[uVar19]);
                  uVar19 = uVar19 + 1;
                } while (uVar2 != uVar19);
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 != uVar15);
          }
          if (iVar6 == 0) {
            pfVar5 = (float *)pppfVar9[uVar11][sVar13];
            uVar18 = (ulong)veclen[sVar13];
            if ((*pfVar5 != 0.0) || (NAN(*pfVar5))) {
              if (uVar18 != 0) {
                uVar19 = 0;
                do {
                  fVar23 = (float)pfVar16[uVar19] / *pfVar5;
                  pfVar16[uVar19] = (float32)fVar23;
                  fVar24 = (float)pfVar17[uVar19] / *pfVar5 - fVar23 * fVar23;
                  fVar23 = fVar20;
                  if (fVar20 <= fVar24) {
                    fVar23 = fVar24;
                  }
                  pfVar17[uVar19] = (float32)fVar23;
                  uVar19 = uVar19 + 1;
                } while (uVar18 != uVar19);
              }
            }
            else if (uVar18 != 0) {
              uVar19 = 0;
              do {
                fVar23 = (float)pfVar16[uVar19];
                if ((fVar23 != 0.0) || (NAN(fVar23))) {
                  err_msg(ERR_FATAL,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                          ,0x35c,"denominator = 0, but numerator = %f at k = %d\n",(double)fVar23);
                  goto LAB_0010e14b;
                }
                uVar19 = uVar19 + 1;
              } while (uVar18 != uVar19);
            }
          }
          sVar13 = sVar13 + 1;
        } while (sVar13 != d2);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar12);
    uVar11 = 0;
    if (n_state != 0) {
      fVar20 = 0.0;
      uVar18 = 0;
      do {
        if (fVar20 < (float)stwt[uVar18]) {
          uVar11 = uVar18 & 0xffffffff;
          fVar20 = (float)stwt[uVar18];
        }
        uVar18 = uVar18 + 1;
      } while (uVar12 != uVar18);
    }
  }
  if (n_density == 0) {
    fVar20 = 0.0;
  }
  else {
    fVar20 = 0.0;
    uVar18 = 0;
    do {
      fVar20 = fVar20 + (float)(*pppfVar9[uVar11])[uVar18];
      uVar18 = uVar18 + 1;
    } while (uVar8 != uVar18);
  }
  if (n_state == 0) {
    local_78 = 0.0;
  }
  else {
    local_78 = 0.0;
    uVar11 = 0;
    do {
      dVar21 = 0.0;
      if (n_stream != 0) {
        sVar13 = 0;
        do {
          *(undefined8 *)((long)ptr + sVar13 * 8) = 0;
          if (n_density != 0) {
            dVar21 = 0.0;
            uVar18 = 0;
            do {
              dVar21 = dVar21 + (double)(float)pppfVar9[uVar11][sVar13][uVar18];
              uVar18 = uVar18 + 1;
            } while (uVar8 != uVar18);
            *(double *)((long)ptr + sVar13 * 8) = dVar21;
          }
          sVar13 = sVar13 + 1;
        } while (sVar13 != d2);
        dVar21 = 0.0;
        if (n_stream != 0) {
          sVar13 = 0;
          do {
            dVar1 = *(double *)((long)ptr + sVar13 * 8);
            if (iVar6 == 0) {
              dVar22 = (double)ent_cont(local_68[uVar11][sVar13],local_70[uVar11][sVar13],
                                        veclen[sVar13]);
            }
            else {
              if (n_density == 0) {
                pfVar16 = *(float32 **)((long)tmpptr + sVar13 * 8);
              }
              else {
                pfVar17 = pppfVar9[uVar11][sVar13];
                pfVar16 = *(float32 **)((long)tmpptr + sVar13 * 8);
                uVar18 = 0;
                do {
                  fVar23 = (float)((double)(float)pfVar17[uVar18] * (1.0 / dVar1));
                  fVar25 = mwfloor;
                  if ((float)mwfloor <= fVar23) {
                    fVar25 = (float32)fVar23;
                  }
                  pfVar16[uVar18] = fVar25;
                  uVar18 = uVar18 + 1;
                } while (uVar8 != uVar18);
              }
              dVar22 = (double)ent_d(pfVar16,n_density);
            }
            dVar21 = dVar21 + dVar1 * dVar22;
            sVar13 = sVar13 + 1;
          } while (sVar13 != d2);
        }
      }
      local_78 = local_78 + (double)(float)stwt[uVar11] * dVar21;
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar12);
  }
  node->node_id = node_id;
  puVar10 = (uint32 *)
            __ckd_calloc__(uVar15,4,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                           ,0x38d);
  if (n_id != 0) {
    uVar12 = 0;
    do {
      puVar10[uVar12] = id[uVar12];
      uVar12 = uVar12 + 1;
    } while (uVar15 != uVar12);
  }
  node->id = puVar10;
  node->n_id = n_id;
  node->mixw_occ = pppfVar9;
  if (iVar6 == 0) {
    node->means = local_68;
    node->vars = local_70;
  }
  node->occ = (float32)fVar20;
  node->wt_ent = (float64)local_78;
  ckd_free_2d(tmpptr);
  ckd_free(ptr);
  return 0;
}

Assistant:

int
mk_node(dtree_node_t *node,
	uint32 node_id,
	uint32 *id,
	uint32 n_id,
	float32 ****mixw,
        float32 ****means,
        float32 ****vars,
        uint32  *veclen,
	uint32 n_model,
	uint32 n_state,
	uint32 n_stream,
	uint32 n_density,
	float32 *stwt,
	float32 mwfloor)
{
    float32 ***mixw_occ, **dist;
    uint32 mm, m, s, j, k;
    float64 *dnom, norm, wt_ent, s_wt_ent, occ;
    float32 mx_wt;
    uint32 *l_id;
    float32 ***lmeans=0,***lvars=0;
    float32 varfloor=0;
    uint32 continuous, sumveclen;
    char*  type;

    type = (char *)cmd_ln_str("-ts2cbfn");
    if (strcmp(type,".semi.")!=0 && strcmp(type,".cont.") != 0)
        E_FATAL("Type %s unsupported; trees can only be built on types .semi. or .cont.\n",type);
    if (strcmp(type,".cont.") == 0) 
        continuous = 1;
    else 
        continuous = 0;

    if (continuous == 1) {
        varfloor = cmd_ln_float32("-varfloor");
        /* Sumveclen is overallocation, but coding is simpler */
        for (j=0,sumveclen=0; j < n_stream; j++) sumveclen += veclen[j];

        lmeans   = (float32 ***) ckd_calloc_3d(n_state,n_stream,sumveclen,sizeof(float32));
        lvars   = (float32 ***) ckd_calloc_3d(n_state,n_stream,sumveclen,sizeof(float32));
    }

    mixw_occ = (float32 ***)ckd_calloc_3d(n_state, n_stream, n_density, sizeof(float32));
    dist     = (float32 **)ckd_calloc_2d(n_stream, n_density, sizeof(float32));
    dnom     = (float64 *)ckd_calloc(n_stream, sizeof(float64));

    /* Merge distributions of all the elements in a cluster for combined
       distribution */
    for (s = 0; s < n_state; s++) {
	for (j = 0; j < n_stream; j++) {
            float32 *lmeanvec=0, *lvarvec=0;
            if (continuous == 1) {
                lmeanvec = lmeans[s][j];
                lvarvec = lvars[s][j];
            }
	    for (mm = 0; mm < n_id; mm++) {
	        m = id[mm];
		for (k = 0; k < n_density; k++) {
		    mixw_occ[s][j][k] += mixw[m][s][j][k];
		}
                /* For continuous hmms we have only one gaussian per state */
                if (continuous == 1) {
                    for (k = 0; k < veclen[j]; k++) {
                        lmeanvec[k] += mixw[m][s][j][0] * means[m][s][j][k];
                        lvarvec[k] += mixw[m][s][j][0] * (vars[m][s][j][k] + 
                                        means[m][s][j][k] * means[m][s][j][k]);
	            }
	        }
	    }
            if (continuous == 1) {
                if (mixw_occ[s][j][0] != 0) {
                    for (k = 0; k < veclen[j]; k++) {
                        lmeanvec[k] /= mixw_occ[s][j][0];
                        lvarvec[k] = lvarvec[k]/mixw_occ[s][j][0] - 
                                            lmeanvec[k]*lmeanvec[k];
                        if (lvarvec[k] < varfloor) lvarvec[k] = varfloor;
	            }
	        }
                else {
                    for (k = 0; k < veclen[j]; k++) 
                        if (lmeanvec[k] != 0)
                            E_FATAL("denominator = 0, but numerator = %f at k = %d\n",lmeanvec[k],k);
                }
	    }
	}
    }

    /* Find out which state is under consideration */
    for (j = 0, mx_wt = 0, s = 0; s < n_state; s++) {
	if (stwt[s] > mx_wt) {
	    mx_wt = stwt[s];
	    j = s;
	}
    }

    /* occ is the same for each independent feature, so just choose 0 */
    for (k = 0, occ = 0; k < n_density; k++) {
	occ += mixw_occ[j][0][k];
    }

    for (s = 0, wt_ent = 0; s < n_state; s++) {
	for (j = 0; j < n_stream; j++) {
	    for (k = 0, dnom[j] = 0; k < n_density; k++) {
	        dnom[j] += mixw_occ[s][j][k];
	    }
	}

	for (j = 0, s_wt_ent = 0; j < n_stream; j++) {
	    norm = 1.0 / dnom[j];

            /* discrete_entropy for discrete case, continuous entropy for
               continuous HMMs */
            if (continuous != 1) {
	        for (k = 0; k < n_density; k++) {
	    	    dist[j][k] = mixw_occ[s][j][k] * norm;
		    if (dist[j][k] < mwfloor)
		        dist[j][k] = mwfloor;
	        }

	        s_wt_ent += dnom[j] * ent_d(dist[j], n_density);
            }
            else {
	        s_wt_ent += dnom[j] * ent_cont(lmeans[s][j], lvars[s][j], veclen[j]);
            }
	}

	wt_ent += stwt[s] * s_wt_ent;
    }

    node->node_id = node_id;
    l_id = ckd_calloc(n_id, sizeof(uint32));
    for (j = 0; j < n_id; j++) {
	l_id[j] = id[j];
    }
    node->id = l_id;
    node->n_id = n_id;
    node->mixw_occ = mixw_occ;
    if (continuous == 1) {
        node->means = lmeans;
        node->vars = lvars;
    }
    node->occ = occ;
    node->wt_ent = wt_ent;

    ckd_free_2d((void **)dist);
    ckd_free((void *)dnom);

    return S3_SUCCESS;
}